

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_16781328,_true,_embree::sse2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 (*pauVar20) [16];
  int iVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong unaff_R15;
  undefined4 uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  vfloat4 a0;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar73;
  float fVar78;
  float fVar80;
  float fVar81;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar83;
  undefined1 auVar74 [16];
  float fVar79;
  float fVar82;
  float fVar84;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar87 [12];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar97;
  vfloat4 a;
  float fVar98;
  undefined1 auVar96 [16];
  float fVar99;
  float fVar100;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1018 = aVar6.x;
    local_1028 = aVar6.y;
    local_1008 = aVar6.z;
    aVar83 = aVar6.field_3;
    fVar35 = local_1028 * local_1028;
    fVar36 = local_1008 * local_1008;
    fVar37 = aVar83.w * aVar83.w;
    fVar52 = fVar35 + local_1018 * local_1018 + fVar36;
    auVar62._0_8_ = CONCAT44(fVar35 + fVar35 + fVar37,fVar52);
    auVar62._8_4_ = fVar35 + fVar36 + fVar36;
    auVar62._12_4_ = fVar35 + fVar37 + fVar37;
    auVar64._8_4_ = auVar62._8_4_;
    auVar64._0_8_ = auVar62._0_8_;
    auVar64._12_4_ = auVar62._12_4_;
    auVar62 = rsqrtss(auVar64,auVar62);
    fVar35 = auVar62._0_4_;
    local_fb8[0] = fVar35 * 1.5 - fVar35 * fVar35 * fVar52 * 0.5 * fVar35;
    fVar35 = local_1018 * local_fb8[0];
    fVar36 = local_1028 * local_fb8[0];
    fVar37 = local_1008 * local_fb8[0];
    fVar94 = -fVar36;
    fVar52 = -fVar37;
    auVar87._8_4_ = 0xffffffff;
    auVar87._0_8_ = 0xffffffffffffffff;
    if (fVar94 * fVar94 + fVar37 * fVar37 + 0.0 <= fVar35 * fVar35 + fVar52 * fVar52 + 0.0) {
      auVar87 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar78 = (float)((uint)fVar37 & auVar87._4_4_);
    fVar52 = (float)(~auVar87._0_4_ & (uint)fVar52);
    fVar81 = (float)(~auVar87._8_4_ & (uint)fVar35 | (uint)fVar94 & auVar87._8_4_);
    fVar94 = fVar78 * fVar78;
    fVar80 = fVar81 * fVar81;
    fVar95 = fVar94 + fVar52 * fVar52 + fVar80;
    auVar71._0_8_ = CONCAT44(fVar94 + fVar94 + 0.0,fVar95);
    auVar71._8_4_ = fVar94 + fVar80 + fVar80;
    auVar71._12_4_ = fVar94 + 0.0 + 0.0;
    auVar77._8_4_ = auVar71._8_4_;
    auVar77._0_8_ = auVar71._0_8_;
    auVar77._12_4_ = auVar71._12_4_;
    auVar62 = rsqrtss(auVar77,auVar71);
    fVar94 = auVar62._0_4_;
    fVar94 = fVar94 * 1.5 - fVar94 * fVar94 * fVar95 * 0.5 * fVar94;
    fVar52 = fVar94 * fVar52;
    fVar78 = fVar94 * fVar78;
    fVar81 = fVar94 * fVar81;
    fVar80 = fVar78 * fVar35 - fVar36 * fVar52;
    fVar95 = fVar81 * fVar36 - fVar37 * fVar78;
    fVar91 = fVar52 * fVar37 - fVar35 * fVar81;
    fVar93 = fVar94 * 0.0 * aVar83.w * local_fb8[0] - aVar83.w * local_fb8[0] * fVar94 * 0.0;
    fVar94 = fVar95 * fVar95;
    fVar92 = fVar91 * fVar91;
    fVar93 = fVar93 * fVar93;
    fVar99 = fVar92 + fVar94 + fVar80 * fVar80;
    auVar90._0_8_ = CONCAT44(fVar93 + fVar94 + fVar94,fVar99);
    auVar90._8_4_ = fVar92 + fVar94 + fVar92;
    auVar90._12_4_ = fVar93 + fVar94 + fVar93;
    auVar60._8_4_ = auVar90._8_4_;
    auVar60._0_8_ = auVar90._0_8_;
    auVar60._12_4_ = auVar90._12_4_;
    auVar62 = rsqrtss(auVar60,auVar90);
    fVar94 = auVar62._0_4_;
    fVar94 = fVar94 * 1.5 - fVar94 * fVar94 * fVar99 * 0.5 * fVar94;
    local_f88._4_4_ = fVar94 * fVar80;
    local_f88._0_4_ = fVar81;
    local_f88._8_4_ = local_fb8[0] * fVar37;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar94 * fVar91;
    local_f98._0_4_ = fVar78;
    local_f98._8_4_ = local_fb8[0] * fVar36;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar94 * fVar95;
    local_fa8._0_4_ = fVar52;
    local_fa8._8_4_ = local_fb8[0] * fVar35;
    local_fa8._12_4_ = 0;
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar26 = (undefined1 (*) [16])local_f68;
      fVar36 = (ray->super_RayK<1>).org.field_0.m128[0];
      fVar37 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_10c8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar35 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_1038 = 0.0;
      if (0.0 <= fVar35) {
        local_1038 = fVar35;
      }
      fVar35 = (ray->super_RayK<1>).tfar;
      fVar52 = 0.0;
      if (0.0 <= fVar35) {
        fVar52 = fVar35;
      }
      auVar62 = divps(_DAT_01feca10,(undefined1  [16])aVar6);
      local_10a8 = (float)(~-(uint)(1e-18 <= ABS(local_1018)) & 0x5d5e0b6b |
                          auVar62._0_4_ & -(uint)(1e-18 <= ABS(local_1018)));
      local_10d8 = (float)(~-(uint)(1e-18 <= ABS(local_1028)) & 0x5d5e0b6b |
                          auVar62._4_4_ & -(uint)(1e-18 <= ABS(local_1028)));
      local_1048 = (float)(~-(uint)(1e-18 <= ABS(local_1008)) & 0x5d5e0b6b |
                          auVar62._8_4_ & -(uint)(1e-18 <= ABS(local_1008)));
      local_1068 = local_10a8 * 0.99999964;
      local_1098 = local_10d8 * 0.99999964;
      local_1058 = local_1048 * 0.99999964;
      local_10a8 = local_10a8 * 1.0000004;
      local_10d8 = local_10d8 * 1.0000004;
      local_1048 = local_1048 * 1.0000004;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      uVar25 = (ulong)(local_1068 < 0.0) * 0x10;
      uVar28 = (ulong)(local_1098 < 0.0) << 4 | 0x20;
      uVar29 = (ulong)(local_1058 < 0.0) << 4 | 0x40;
      fStack_10c4 = local_10c8;
      fStack_10c0 = local_10c8;
      fStack_10bc = local_10c8;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1094 = local_1098;
      fStack_1090 = local_1098;
      fStack_108c = local_1098;
      fStack_10a4 = local_10a8;
      fStack_10a0 = local_10a8;
      fStack_109c = local_10a8;
      fStack_10d4 = local_10d8;
      fStack_10d0 = local_10d8;
      fStack_10cc = local_10d8;
      local_1080 = ray;
      fVar35 = fVar52;
      fVar94 = fVar52;
      fVar78 = fVar52;
      fVar80 = local_1068;
      fVar81 = local_1068;
      fVar95 = local_1068;
      fVar91 = local_1068;
      fVar92 = local_1038;
      fVar93 = local_1038;
      fVar99 = local_1038;
      fVar72 = local_1038;
      fVar73 = local_10c8;
      fVar79 = local_10c8;
      fVar82 = local_10c8;
      fVar84 = local_10c8;
      fVar85 = local_1058;
      fVar86 = local_1058;
      fVar105 = local_1058;
      fVar106 = local_1058;
      fVar107 = local_10d8;
      fVar108 = local_10d8;
      fVar109 = local_10d8;
      fVar110 = local_10d8;
      fVar111 = local_1098;
      fVar112 = local_1098;
      fVar113 = local_1098;
      fVar114 = local_1098;
      fVar115 = local_10a8;
      fVar116 = local_10a8;
      fVar97 = local_10a8;
      fVar98 = local_10a8;
      fVar100 = local_1048;
      fVar102 = local_1048;
      fVar103 = local_1048;
      fVar104 = local_1048;
      do {
        do {
          if (pauVar26 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar20 = pauVar26 + -1;
          pauVar26 = pauVar26 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar20 + 8));
        uVar23 = *(ulong *)*pauVar26;
        do {
          if ((uVar23 & 8) == 0) {
            fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar24 = (uint)uVar23 & 7;
            uVar22 = uVar23 & 0xfffffffffffffff0;
            uVar31 = (undefined4)(unaff_R15 >> 0x20);
            if (uVar24 == 3) {
              local_fd8 = *(float *)(uVar22 + 0x70);
              fStack_fd4 = *(float *)(uVar22 + 0x74);
              fStack_fd0 = *(float *)(uVar22 + 0x78);
              fStack_fcc = *(float *)(uVar22 + 0x7c);
              local_ff8 = *(float *)(uVar22 + 0x80);
              fStack_ff4 = *(float *)(uVar22 + 0x84);
              fStack_ff0 = *(float *)(uVar22 + 0x88);
              fStack_fec = *(float *)(uVar22 + 0x8c);
              local_fe8 = *(float *)(uVar22 + 0x90);
              fStack_fe4 = *(float *)(uVar22 + 0x94);
              fStack_fe0 = *(float *)(uVar22 + 0x98);
              fStack_fdc = *(float *)(uVar22 + 0x9c);
              local_fc8 = *(float *)(uVar22 + 0xa0);
              fStack_fc4 = *(float *)(uVar22 + 0xa4);
              fStack_fc0 = *(float *)(uVar22 + 0xa8);
              fStack_fbc = *(float *)(uVar22 + 0xac);
              fVar85 = 1.0 - fVar5;
              fVar86 = fVar85 * 0.0;
              fVar80 = local_1018 * *(float *)(uVar22 + 0x20) +
                       local_1028 * *(float *)(uVar22 + 0x50) + local_1008 * local_ff8;
              fVar81 = fStack_1014 * *(float *)(uVar22 + 0x24) +
                       fStack_1024 * *(float *)(uVar22 + 0x54) + fStack_1004 * fStack_ff4;
              fVar95 = fStack_1010 * *(float *)(uVar22 + 0x28) +
                       fStack_1020 * *(float *)(uVar22 + 0x58) + fStack_1000 * fStack_ff0;
              fVar91 = fStack_100c * *(float *)(uVar22 + 0x2c) +
                       fStack_101c * *(float *)(uVar22 + 0x5c) + fStack_ffc * fStack_fec;
              fVar92 = local_1018 * *(float *)(uVar22 + 0x30) +
                       local_1028 * *(float *)(uVar22 + 0x60) + local_1008 * local_fe8;
              fVar93 = fStack_1014 * *(float *)(uVar22 + 0x34) +
                       fStack_1024 * *(float *)(uVar22 + 100) + fStack_1004 * fStack_fe4;
              fVar99 = fStack_1010 * *(float *)(uVar22 + 0x38) +
                       fStack_1020 * *(float *)(uVar22 + 0x68) + fStack_1000 * fStack_fe0;
              fVar72 = fStack_100c * *(float *)(uVar22 + 0x3c) +
                       fStack_101c * *(float *)(uVar22 + 0x6c) + fStack_ffc * fStack_fdc;
              fVar73 = local_1018 * *(float *)(uVar22 + 0x40) +
                       local_1028 * local_fd8 + local_1008 * local_fc8;
              fVar79 = fStack_1014 * *(float *)(uVar22 + 0x44) +
                       fStack_1024 * fStack_fd4 + fStack_1004 * fStack_fc4;
              fVar82 = fStack_1010 * *(float *)(uVar22 + 0x48) +
                       fStack_1020 * fStack_fd0 + fStack_1000 * fStack_fc0;
              fVar84 = fStack_100c * *(float *)(uVar22 + 0x4c) +
                       fStack_101c * fStack_fcc + fStack_ffc * fStack_fbc;
              uVar24 = -(uint)(1e-18 <= ABS(fVar80));
              uVar32 = -(uint)(1e-18 <= ABS(fVar81));
              uVar33 = -(uint)(1e-18 <= ABS(fVar95));
              uVar34 = -(uint)(1e-18 <= ABS(fVar91));
              auVar46._0_4_ = (uint)fVar80 & uVar24;
              auVar46._4_4_ = (uint)fVar81 & uVar32;
              auVar46._8_4_ = (uint)fVar95 & uVar33;
              auVar46._12_4_ = (uint)fVar91 & uVar34;
              auVar56._0_8_ = CONCAT44(~uVar32,~uVar24) & 0x219392ef219392ef;
              auVar56._8_4_ = ~uVar33 & 0x219392ef;
              auVar56._12_4_ = ~uVar34 & 0x219392ef;
              auVar56 = auVar56 | auVar46;
              uVar24 = -(uint)(1e-18 <= ABS(fVar92));
              uVar32 = -(uint)(1e-18 <= ABS(fVar93));
              uVar33 = -(uint)(1e-18 <= ABS(fVar99));
              uVar34 = -(uint)(1e-18 <= ABS(fVar72));
              auVar66._0_4_ = (uint)fVar92 & uVar24;
              auVar66._4_4_ = (uint)fVar93 & uVar32;
              auVar66._8_4_ = (uint)fVar99 & uVar33;
              auVar66._12_4_ = (uint)fVar72 & uVar34;
              auVar47._0_8_ = CONCAT44(~uVar32,~uVar24) & 0x219392ef219392ef;
              auVar47._8_4_ = ~uVar33 & 0x219392ef;
              auVar47._12_4_ = ~uVar34 & 0x219392ef;
              auVar47 = auVar47 | auVar66;
              uVar24 = -(uint)(1e-18 <= ABS(fVar73));
              uVar32 = -(uint)(1e-18 <= ABS(fVar79));
              uVar33 = -(uint)(1e-18 <= ABS(fVar82));
              uVar34 = -(uint)(1e-18 <= ABS(fVar84));
              auVar75._0_4_ = (uint)fVar73 & uVar24;
              auVar75._4_4_ = (uint)fVar79 & uVar32;
              auVar75._8_4_ = (uint)fVar82 & uVar33;
              auVar75._12_4_ = (uint)fVar84 & uVar34;
              auVar67._0_8_ = CONCAT44(~uVar32,~uVar24) & 0x219392ef219392ef;
              auVar67._8_4_ = ~uVar33 & 0x219392ef;
              auVar67._12_4_ = ~uVar34 & 0x219392ef;
              auVar67 = auVar67 | auVar75;
              auVar62 = rcpps(auVar75,auVar56);
              fVar73 = auVar62._0_4_;
              fVar79 = auVar62._4_4_;
              fVar82 = auVar62._8_4_;
              fVar84 = auVar62._12_4_;
              fVar73 = (1.0 - auVar56._0_4_ * fVar73) * fVar73 + fVar73;
              fVar79 = (1.0 - auVar56._4_4_ * fVar79) * fVar79 + fVar79;
              fVar82 = (1.0 - auVar56._8_4_ * fVar82) * fVar82 + fVar82;
              fVar84 = (1.0 - auVar56._12_4_ * fVar84) * fVar84 + fVar84;
              auVar62 = rcpps(auVar62,auVar47);
              fVar92 = auVar62._0_4_;
              fVar93 = auVar62._4_4_;
              fVar99 = auVar62._8_4_;
              fVar72 = auVar62._12_4_;
              fVar92 = (1.0 - auVar47._0_4_ * fVar92) * fVar92 + fVar92;
              fVar93 = (1.0 - auVar47._4_4_ * fVar93) * fVar93 + fVar93;
              fVar99 = (1.0 - auVar47._8_4_ * fVar99) * fVar99 + fVar99;
              fVar72 = (1.0 - auVar47._12_4_ * fVar72) * fVar72 + fVar72;
              auVar62 = rcpps(auVar62,auVar67);
              fVar80 = auVar62._0_4_;
              fVar81 = auVar62._4_4_;
              fVar95 = auVar62._8_4_;
              fVar91 = auVar62._12_4_;
              fVar80 = (1.0 - auVar67._0_4_ * fVar80) * fVar80 + fVar80;
              fVar81 = (1.0 - auVar67._4_4_ * fVar81) * fVar81 + fVar81;
              fVar95 = (1.0 - auVar67._8_4_ * fVar95) * fVar95 + fVar95;
              fVar91 = (1.0 - auVar67._12_4_ * fVar91) * fVar91 + fVar91;
              local_10b8 = *(float *)(uVar22 + 0x50) * fVar37 +
                           local_ff8 * local_10c8 + *(float *)(uVar22 + 0xb0);
              fStack_10b4 = *(float *)(uVar22 + 0x54) * fVar37 +
                            fStack_ff4 * fStack_10c4 + *(float *)(uVar22 + 0xb4);
              fStack_10b0 = *(float *)(uVar22 + 0x58) * fVar37 +
                            fStack_ff0 * fStack_10c0 + *(float *)(uVar22 + 0xb8);
              fStack_10ac = *(float *)(uVar22 + 0x5c) * fVar37 +
                            fStack_fec * fStack_10bc + *(float *)(uVar22 + 0xbc);
              fVar105 = *(float *)(uVar22 + 0x20) * fVar36 + local_10b8;
              fVar106 = *(float *)(uVar22 + 0x24) * fVar36 + fStack_10b4;
              fVar107 = *(float *)(uVar22 + 0x28) * fVar36 + fStack_10b0;
              fVar108 = *(float *)(uVar22 + 0x2c) * fVar36 + fStack_10ac;
              fVar109 = *(float *)(uVar22 + 0x30) * fVar36 +
                        *(float *)(uVar22 + 0x60) * fVar37 +
                        local_fe8 * local_10c8 + *(float *)(uVar22 + 0xc0);
              fVar110 = *(float *)(uVar22 + 0x34) * fVar36 +
                        *(float *)(uVar22 + 100) * fVar37 +
                        fStack_fe4 * fStack_10c4 + *(float *)(uVar22 + 0xc4);
              fVar111 = *(float *)(uVar22 + 0x38) * fVar36 +
                        *(float *)(uVar22 + 0x68) * fVar37 +
                        fStack_fe0 * fStack_10c0 + *(float *)(uVar22 + 200);
              fVar112 = *(float *)(uVar22 + 0x3c) * fVar36 +
                        *(float *)(uVar22 + 0x6c) * fVar37 +
                        fStack_fdc * fStack_10bc + *(float *)(uVar22 + 0xcc);
              fVar113 = *(float *)(uVar22 + 0x40) * fVar36 +
                        local_fd8 * fVar37 + local_fc8 * local_10c8 + *(float *)(uVar22 + 0xd0);
              fVar114 = *(float *)(uVar22 + 0x44) * fVar36 +
                        fStack_fd4 * fVar37 + fStack_fc4 * fStack_10c4 + *(float *)(uVar22 + 0xd4);
              fVar115 = *(float *)(uVar22 + 0x48) * fVar36 +
                        fStack_fd0 * fVar37 + fStack_fc0 * fStack_10c0 + *(float *)(uVar22 + 0xd8);
              fVar116 = *(float *)(uVar22 + 0x4c) * fVar36 +
                        fStack_fcc * fVar37 + fStack_fbc * fStack_10bc + *(float *)(uVar22 + 0xdc);
              auVar101._0_8_ =
                   CONCAT44(((*(float *)(uVar22 + 0xe4) * fVar5 + fVar86) - fVar106) * fVar79,
                            ((*(float *)(uVar22 + 0xe0) * fVar5 + fVar86) - fVar105) * fVar73);
              auVar101._8_4_ = ((*(float *)(uVar22 + 0xe8) * fVar5 + fVar86) - fVar107) * fVar82;
              auVar101._12_4_ = ((*(float *)(uVar22 + 0xec) * fVar5 + fVar86) - fVar108) * fVar84;
              fVar73 = ((*(float *)(uVar22 + 0x110) * fVar5 + fVar85) - fVar105) * fVar73;
              fVar79 = ((*(float *)(uVar22 + 0x114) * fVar5 + fVar85) - fVar106) * fVar79;
              fVar82 = ((*(float *)(uVar22 + 0x118) * fVar5 + fVar85) - fVar107) * fVar82;
              fVar84 = ((*(float *)(uVar22 + 0x11c) * fVar5 + fVar85) - fVar108) * fVar84;
              auVar96._0_8_ =
                   CONCAT44(((*(float *)(uVar22 + 0xf4) * fVar5 + fVar86) - fVar110) * fVar93,
                            ((*(float *)(uVar22 + 0xf0) * fVar5 + fVar86) - fVar109) * fVar92);
              auVar96._8_4_ = ((*(float *)(uVar22 + 0xf8) * fVar5 + fVar86) - fVar111) * fVar99;
              auVar96._12_4_ = ((*(float *)(uVar22 + 0xfc) * fVar5 + fVar86) - fVar112) * fVar72;
              auVar88._0_8_ =
                   CONCAT44(((fVar86 + *(float *)(uVar22 + 0x104) * fVar5) - fVar114) * fVar81,
                            ((fVar86 + *(float *)(uVar22 + 0x100) * fVar5) - fVar113) * fVar80);
              auVar88._8_4_ = ((fVar86 + *(float *)(uVar22 + 0x108) * fVar5) - fVar115) * fVar95;
              auVar88._12_4_ = ((fVar86 + *(float *)(uVar22 + 0x10c) * fVar5) - fVar116) * fVar91;
              fVar92 = ((*(float *)(uVar22 + 0x120) * fVar5 + fVar85) - fVar109) * fVar92;
              fVar93 = ((*(float *)(uVar22 + 0x124) * fVar5 + fVar85) - fVar110) * fVar93;
              fVar99 = ((*(float *)(uVar22 + 0x128) * fVar5 + fVar85) - fVar111) * fVar99;
              fVar72 = ((*(float *)(uVar22 + 300) * fVar5 + fVar85) - fVar112) * fVar72;
              auVar39._0_4_ = ((fVar5 * *(float *)(uVar22 + 0x130) + fVar85) - fVar113) * fVar80;
              auVar39._4_4_ = ((fVar5 * *(float *)(uVar22 + 0x134) + fVar85) - fVar114) * fVar81;
              auVar39._8_4_ = ((fVar5 * *(float *)(uVar22 + 0x138) + fVar85) - fVar115) * fVar95;
              auVar39._12_4_ = ((fVar5 * *(float *)(uVar22 + 0x13c) + fVar85) - fVar116) * fVar91;
              auVar48._8_4_ = auVar96._8_4_;
              auVar48._0_8_ = auVar96._0_8_;
              auVar48._12_4_ = auVar96._12_4_;
              auVar15._4_4_ = fVar93;
              auVar15._0_4_ = fVar92;
              auVar15._8_4_ = fVar99;
              auVar15._12_4_ = fVar72;
              auVar62 = minps(auVar48,auVar15);
              auVar57._8_4_ = auVar88._8_4_;
              auVar57._0_8_ = auVar88._0_8_;
              auVar57._12_4_ = auVar88._12_4_;
              auVar64 = minps(auVar57,auVar39);
              auVar64 = maxps(auVar62,auVar64);
              auVar58._8_4_ = auVar101._8_4_;
              auVar58._0_8_ = auVar101._0_8_;
              auVar58._12_4_ = auVar101._12_4_;
              auVar17._4_4_ = fVar79;
              auVar17._0_4_ = fVar73;
              auVar17._8_4_ = fVar82;
              auVar17._12_4_ = fVar84;
              auVar62 = minps(auVar58,auVar17);
              auVar18._4_4_ = fVar79;
              auVar18._0_4_ = fVar73;
              auVar18._8_4_ = fVar82;
              auVar18._12_4_ = fVar84;
              auVar77 = maxps(auVar101,auVar18);
              auVar19._4_4_ = fStack_1034;
              auVar19._0_4_ = local_1038;
              auVar19._8_4_ = fStack_1030;
              auVar19._12_4_ = fStack_102c;
              auVar16._4_4_ = fVar93;
              auVar16._0_4_ = fVar92;
              auVar16._8_4_ = fVar99;
              auVar16._12_4_ = fVar72;
              auVar71 = maxps(auVar96,auVar16);
              auVar60 = maxps(auVar88,auVar39);
              auVar60 = minps(auVar71,auVar60);
              auVar62 = maxps(auVar19,auVar62);
              auVar62 = maxps(auVar62,auVar64);
              auVar49._4_4_ = fVar35;
              auVar49._0_4_ = fVar52;
              auVar49._8_4_ = fVar94;
              auVar49._12_4_ = fVar78;
              auVar64 = minps(auVar49,auVar77);
              auVar64 = minps(auVar64,auVar60);
              local_10e8._0_4_ = auVar62._0_4_ * 0.99999964;
              local_10e8._4_4_ = auVar62._4_4_ * 0.99999964;
              fStack_10e0 = auVar62._8_4_ * 0.99999964;
              fStack_10dc = auVar62._12_4_ * 0.99999964;
              auVar40._4_4_ = -(uint)((float)local_10e8._4_4_ <= auVar64._4_4_ * 1.0000004);
              auVar40._0_4_ = -(uint)((float)local_10e8._0_4_ <= auVar64._0_4_ * 1.0000004);
              auVar40._8_4_ = -(uint)(fStack_10e0 <= auVar64._8_4_ * 1.0000004);
              auVar40._12_4_ = -(uint)(fStack_10dc <= auVar64._12_4_ * 1.0000004);
              uVar30 = movmskps((int)unaff_R15,auVar40);
              unaff_R15 = CONCAT44(uVar31,uVar30);
              fVar80 = local_1068;
              fVar81 = fStack_1064;
              fVar95 = fStack_1060;
              fVar91 = fStack_105c;
              fVar92 = local_1038;
              fVar93 = fStack_1034;
              fVar99 = fStack_1030;
              fVar72 = fStack_102c;
              fVar73 = local_10c8;
              fVar79 = fStack_10c4;
              fVar82 = fStack_10c0;
              fVar84 = fStack_10bc;
              fVar85 = local_1058;
              fVar86 = fStack_1054;
              fVar105 = fStack_1050;
              fVar106 = fStack_104c;
              fVar107 = local_10d8;
              fVar108 = fStack_10d4;
              fVar109 = fStack_10d0;
              fVar110 = fStack_10cc;
              fVar111 = local_1098;
              fVar112 = fStack_1094;
              fVar113 = fStack_1090;
              fVar114 = fStack_108c;
              fVar115 = local_10a8;
              fVar116 = fStack_10a4;
              fVar97 = fStack_10a0;
              fVar98 = fStack_109c;
              fVar100 = local_1048;
              fVar102 = fStack_1044;
              fVar103 = fStack_1040;
              fVar104 = fStack_103c;
            }
            else {
              pfVar3 = (float *)(uVar22 + 0x80 + uVar25);
              pfVar1 = (float *)(uVar22 + 0x20 + uVar25);
              pfVar4 = (float *)(uVar22 + 0x80 + uVar28);
              pfVar2 = (float *)(uVar22 + 0x20 + uVar28);
              auVar53._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar36) * fVar80;
              auVar53._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar36) * fVar81;
              auVar53._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar36) * fVar95;
              auVar53._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar36) * fVar91;
              auVar63._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar37) * fVar111;
              auVar63._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar37) * fVar112;
              auVar63._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar37) * fVar113;
              auVar63._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar37) * fVar114;
              pfVar2 = (float *)(uVar22 + 0x80 + uVar29);
              pfVar1 = (float *)(uVar22 + 0x20 + uVar29);
              auVar44._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar73) * fVar85;
              auVar44._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar79) * fVar86;
              auVar44._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar82) * fVar105;
              auVar44._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar84) * fVar106;
              auVar64 = maxps(auVar63,auVar44);
              auVar45._4_4_ = fVar93;
              auVar45._0_4_ = fVar92;
              auVar45._8_4_ = fVar99;
              auVar45._12_4_ = fVar72;
              auVar62 = maxps(auVar45,auVar53);
              pfVar2 = (float *)(uVar22 + 0x80 + (uVar25 ^ 0x10));
              pfVar1 = (float *)(uVar22 + 0x20 + (uVar25 ^ 0x10));
              _local_10e8 = maxps(auVar62,auVar64);
              auVar74._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar36) * fVar115;
              auVar74._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar36) * fVar116;
              auVar74._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar36) * fVar97;
              auVar74._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar36) * fVar98;
              pfVar3 = (float *)(uVar22 + 0x80 + (uVar28 ^ 0x10));
              pfVar1 = (float *)(uVar22 + 0x20 + (uVar28 ^ 0x10));
              pfVar4 = (float *)(uVar22 + 0x80 + (uVar29 ^ 0x10));
              pfVar2 = (float *)(uVar22 + 0x20 + (uVar29 ^ 0x10));
              auVar65._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar37) * fVar107;
              auVar65._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar37) * fVar108;
              auVar65._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar37) * fVar109;
              auVar65._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar37) * fVar110;
              auVar54._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar73) * fVar100;
              auVar54._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar79) * fVar102;
              auVar54._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar82) * fVar103;
              auVar54._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar84) * fVar104;
              auVar64 = minps(auVar65,auVar54);
              auVar55._4_4_ = fVar35;
              auVar55._0_4_ = fVar52;
              auVar55._8_4_ = fVar94;
              auVar55._12_4_ = fVar78;
              auVar62 = minps(auVar55,auVar74);
              auVar62 = minps(auVar62,auVar64);
              if (uVar24 == 6) {
                bVar11 = (fVar5 < *(float *)(uVar22 + 0xf0) && *(float *)(uVar22 + 0xe0) <= fVar5)
                         && local_10e8._0_4_ <= auVar62._0_4_;
                bVar12 = (fVar5 < *(float *)(uVar22 + 0xf4) && *(float *)(uVar22 + 0xe4) <= fVar5)
                         && local_10e8._4_4_ <= auVar62._4_4_;
                bVar13 = (fVar5 < *(float *)(uVar22 + 0xf8) && *(float *)(uVar22 + 0xe8) <= fVar5)
                         && local_10e8._8_4_ <= auVar62._8_4_;
                bVar14 = (fVar5 < *(float *)(uVar22 + 0xfc) && *(float *)(uVar22 + 0xec) <= fVar5)
                         && local_10e8._12_4_ <= auVar62._12_4_;
              }
              else {
                bVar11 = local_10e8._0_4_ <= auVar62._0_4_;
                bVar12 = local_10e8._4_4_ <= auVar62._4_4_;
                bVar13 = local_10e8._8_4_ <= auVar62._8_4_;
                bVar14 = local_10e8._12_4_ <= auVar62._12_4_;
              }
              auVar38._0_4_ = (uint)bVar11 * -0x80000000;
              auVar38._4_4_ = (uint)bVar12 * -0x80000000;
              auVar38._8_4_ = (uint)bVar13 * -0x80000000;
              auVar38._12_4_ = (uint)bVar14 * -0x80000000;
              uVar30 = movmskps((int)unaff_R15,auVar38);
              unaff_R15 = CONCAT44(uVar31,uVar30);
            }
          }
          if ((uVar23 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar21 = 4;
            }
            else {
              uVar22 = uVar23 & 0xfffffffffffffff0;
              lVar10 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              iVar21 = 0;
              uVar23 = *(ulong *)(uVar22 + lVar10 * 8);
              uVar27 = unaff_R15 - 1 & unaff_R15;
              if (uVar27 != 0) {
                uVar24 = *(uint *)(local_10e8 + lVar10 * 4);
                lVar10 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                uVar9 = *(ulong *)(uVar22 + lVar10 * 8);
                uVar32 = *(uint *)(local_10e8 + lVar10 * 4);
                uVar27 = uVar27 - 1 & uVar27;
                if (uVar27 == 0) {
                  if (uVar24 < uVar32) {
                    *(ulong *)*pauVar26 = uVar9;
                    *(uint *)((long)*pauVar26 + 8) = uVar32;
                    pauVar26 = pauVar26 + 1;
                  }
                  else {
                    *(ulong *)*pauVar26 = uVar23;
                    *(uint *)((long)*pauVar26 + 8) = uVar24;
                    uVar23 = uVar9;
                    pauVar26 = pauVar26 + 1;
                  }
                }
                else {
                  auVar41._8_4_ = uVar24;
                  auVar41._0_8_ = uVar23;
                  auVar41._12_4_ = 0;
                  auVar50._8_4_ = uVar32;
                  auVar50._0_8_ = uVar9;
                  auVar50._12_4_ = 0;
                  lVar10 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                    }
                  }
                  uVar23 = *(ulong *)(uVar22 + lVar10 * 8);
                  iVar7 = *(int *)(local_10e8 + lVar10 * 4);
                  auVar59._8_4_ = iVar7;
                  auVar59._0_8_ = uVar23;
                  auVar59._12_4_ = 0;
                  auVar68._8_4_ = -(uint)((int)uVar24 < (int)uVar32);
                  uVar27 = uVar27 - 1 & uVar27;
                  iVar21 = 0;
                  if (uVar27 == 0) {
                    auVar68._4_4_ = auVar68._8_4_;
                    auVar68._0_4_ = auVar68._8_4_;
                    auVar68._12_4_ = auVar68._8_4_;
                    auVar62 = auVar41 & auVar68 | ~auVar68 & auVar50;
                    auVar64 = auVar50 & auVar68 | ~auVar68 & auVar41;
                    auVar69._8_4_ = -(uint)(auVar62._8_4_ < iVar7);
                    auVar69._0_8_ = CONCAT44(auVar69._8_4_,auVar69._8_4_);
                    auVar69._12_4_ = auVar69._8_4_;
                    auVar60 = auVar59 & auVar69 | ~auVar69 & auVar62;
                    auVar42._8_4_ = -(uint)(auVar64._8_4_ < auVar60._8_4_);
                    auVar42._4_4_ = auVar42._8_4_;
                    auVar42._0_4_ = auVar42._8_4_;
                    auVar42._12_4_ = auVar42._8_4_;
                    *pauVar26 = ~auVar42 & auVar64 | auVar60 & auVar42;
                    pauVar26[1] = auVar64 & auVar42 | ~auVar42 & auVar60;
                    uVar23 = ~auVar69._0_8_ & uVar23 | auVar62._0_8_ & auVar69._0_8_;
                    pauVar26 = pauVar26 + 2;
                    fVar107 = local_10d8;
                    fVar108 = fStack_10d4;
                    fVar109 = fStack_10d0;
                    fVar110 = fStack_10cc;
                  }
                  else {
                    lVar10 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                      }
                    }
                    iVar8 = *(int *)(local_10e8 + lVar10 * 4);
                    auVar76._8_4_ = iVar8;
                    auVar76._0_8_ = *(undefined8 *)(uVar22 + lVar10 * 8);
                    auVar76._12_4_ = 0;
                    auVar70._4_4_ = auVar68._8_4_;
                    auVar70._0_4_ = auVar68._8_4_;
                    auVar70._8_4_ = auVar68._8_4_;
                    auVar70._12_4_ = auVar68._8_4_;
                    auVar62 = auVar41 & auVar70 | ~auVar70 & auVar50;
                    auVar64 = auVar50 & auVar70 | ~auVar70 & auVar41;
                    auVar89._0_4_ = -(uint)(iVar7 < iVar8);
                    auVar89._4_4_ = -(uint)(iVar7 < iVar8);
                    auVar89._8_4_ = -(uint)(iVar7 < iVar8);
                    auVar89._12_4_ = -(uint)(iVar7 < iVar8);
                    auVar71 = auVar59 & auVar89 | ~auVar89 & auVar76;
                    auVar90 = ~auVar89 & auVar59 | auVar76 & auVar89;
                    auVar61._8_4_ = -(uint)(auVar64._8_4_ < auVar90._8_4_);
                    auVar61._4_4_ = auVar61._8_4_;
                    auVar61._0_4_ = auVar61._8_4_;
                    auVar61._12_4_ = auVar61._8_4_;
                    auVar77 = auVar64 & auVar61 | ~auVar61 & auVar90;
                    auVar51._8_4_ = -(uint)(auVar62._8_4_ < auVar71._8_4_);
                    auVar51._0_8_ = CONCAT44(auVar51._8_4_,auVar51._8_4_);
                    auVar51._12_4_ = auVar51._8_4_;
                    auVar60 = ~auVar51 & auVar62 | auVar71 & auVar51;
                    auVar43._8_4_ = -(uint)(auVar60._8_4_ < auVar77._8_4_);
                    auVar43._4_4_ = auVar43._8_4_;
                    auVar43._0_4_ = auVar43._8_4_;
                    auVar43._12_4_ = auVar43._8_4_;
                    *pauVar26 = ~auVar61 & auVar64 | auVar90 & auVar61;
                    pauVar26[1] = ~auVar43 & auVar60 | auVar77 & auVar43;
                    pauVar26[2] = auVar60 & auVar43 | ~auVar43 & auVar77;
                    uVar23 = auVar62._0_8_ & auVar51._0_8_ | ~auVar51._0_8_ & auVar71._0_8_;
                    pauVar26 = pauVar26 + 3;
                    fVar107 = local_10d8;
                    fVar108 = fStack_10d4;
                    fVar109 = fStack_10d0;
                    fVar110 = fStack_10cc;
                    fVar111 = local_1098;
                    fVar112 = fStack_1094;
                    fVar113 = fStack_1090;
                    fVar114 = fStack_108c;
                    fVar115 = local_10a8;
                    fVar116 = fStack_10a4;
                    fVar97 = fStack_10a0;
                    fVar98 = fStack_109c;
                  }
                }
              }
            }
          }
          else {
            iVar21 = 6;
          }
        } while (iVar21 == 0);
        if (iVar21 == 6) {
          (**(code **)((long)local_1078->leafIntersector +
                      (ulong)*(byte *)(uVar23 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_1070);
          fVar52 = (local_1080->super_RayK<1>).tfar;
          ray = local_1080;
          fVar35 = fVar52;
          fVar94 = fVar52;
          fVar78 = fVar52;
          fVar80 = local_1068;
          fVar81 = fStack_1064;
          fVar95 = fStack_1060;
          fVar91 = fStack_105c;
          fVar92 = local_1038;
          fVar93 = fStack_1034;
          fVar99 = fStack_1030;
          fVar72 = fStack_102c;
          fVar73 = local_10c8;
          fVar79 = fStack_10c4;
          fVar82 = fStack_10c0;
          fVar84 = fStack_10bc;
          fVar85 = local_1058;
          fVar86 = fStack_1054;
          fVar105 = fStack_1050;
          fVar106 = fStack_104c;
          fVar107 = local_10d8;
          fVar108 = fStack_10d4;
          fVar109 = fStack_10d0;
          fVar110 = fStack_10cc;
          fVar111 = local_1098;
          fVar112 = fStack_1094;
          fVar113 = fStack_1090;
          fVar114 = fStack_108c;
          fVar115 = local_10a8;
          fVar116 = fStack_10a4;
          fVar97 = fStack_10a0;
          fVar98 = fStack_109c;
          fVar100 = local_1048;
          fVar102 = fStack_1044;
          fVar103 = fStack_1040;
          fVar104 = fStack_103c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }